

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

string * __thiscall
t_cpp_generator::declare_field_abi_cxx11_
          (string *__return_storage_ptr__,t_cpp_generator *this,t_field *tfield,bool init,
          bool pointer,bool constant,bool reference)

{
  bool bVar1;
  uint uVar2;
  t_type *ptVar3;
  string *__rhs;
  undefined1 auVar4 [12];
  string local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 local_e9;
  string local_e8;
  t_base local_c4;
  t_base_type *ptStack_c0;
  t_base tbase;
  t_type *type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  allocator local_26;
  undefined1 local_25;
  byte local_24;
  byte local_23;
  byte local_22;
  byte local_21;
  bool reference_local;
  bool constant_local;
  bool pointer_local;
  t_field *ptStack_20;
  bool init_local;
  t_field *tfield_local;
  t_cpp_generator *this_local;
  string *result;
  
  local_24 = reference;
  local_25 = 0;
  local_23 = constant;
  local_22 = pointer;
  local_21 = init;
  ptStack_20 = tfield;
  tfield_local = (t_field *)this;
  this_local = (t_cpp_generator *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_26);
  std::allocator<char>::~allocator((allocator<char> *)&local_26);
  if ((local_23 & 1) != 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"const ");
  }
  ptVar3 = t_field::get_type(ptStack_20);
  type_name_abi_cxx11_(&local_58,this,ptVar3,false,false);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  bVar1 = is_reference(this,ptStack_20);
  if (bVar1) {
    std::operator+(&local_98,"::std::shared_ptr<",__return_storage_ptr__);
    std::operator+(&local_78,&local_98,">");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
  }
  if ((local_22 & 1) != 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"*");
  }
  if ((local_24 & 1) != 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"&");
  }
  __rhs = t_field::get_name_abi_cxx11_(ptStack_20);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&type," ",
                 __rhs);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&type);
  std::__cxx11::string::~string((string *)&type);
  if ((local_21 & 1) != 0) {
    ptVar3 = t_field::get_type(ptStack_20);
    ptStack_c0 = (t_base_type *)t_generator::get_true_type(ptVar3);
    uVar2 = (*(ptStack_c0->super_t_type).super_t_doc._vptr_t_doc[5])();
    if ((uVar2 & 1) == 0) {
      uVar2 = (*(ptStack_c0->super_t_type).super_t_doc._vptr_t_doc[10])();
      if ((uVar2 & 1) != 0) {
        type_name_abi_cxx11_(&local_150,this,&ptStack_c0->super_t_type,false,false);
        std::operator+(&local_130," = static_cast<",&local_150);
        std::operator+(&local_110,&local_130,">(0)");
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_110);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_130);
        std::__cxx11::string::~string((string *)&local_150);
      }
    }
    else {
      local_c4 = t_base_type::get_base(ptStack_c0);
      switch(local_c4) {
      case TYPE_VOID:
      case TYPE_STRING:
        break;
      case TYPE_BOOL:
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__," = false");
        break;
      case TYPE_I8:
      case TYPE_I16:
      case TYPE_I32:
      case TYPE_I64:
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__," = 0");
        break;
      case TYPE_DOUBLE:
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__," = 0.0");
        break;
      default:
        local_e9 = 1;
        auVar4 = __cxa_allocate_exception(0x20);
        t_base_type::t_base_name_abi_cxx11_(&local_e8,(t_base_type *)(ulong)local_c4,auVar4._8_4_);
        std::operator+(auVar4._0_8_,"compiler error: no C++ initializer for base type ",&local_e8);
        local_e9 = 0;
        __cxa_throw(auVar4._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
      }
    }
  }
  if ((local_24 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,";");
  }
  return __return_storage_ptr__;
}

Assistant:

string t_cpp_generator::declare_field(t_field* tfield,
                                      bool init,
                                      bool pointer,
                                      bool constant,
                                      bool reference) {
  // TODO(mcslee): do we ever need to initialize the field?
  string result = "";
  if (constant) {
    result += "const ";
  }
  result += type_name(tfield->get_type());
  if (is_reference(tfield)) {
    result = "::std::shared_ptr<" + result + ">";
  }
  if (pointer) {
    result += "*";
  }
  if (reference) {
    result += "&";
  }
  result += " " + tfield->get_name();
  if (init) {
    t_type* type = get_true_type(tfield->get_type());

    if (type->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
      case t_base_type::TYPE_STRING:
        break;
      case t_base_type::TYPE_BOOL:
        result += " = false";
        break;
      case t_base_type::TYPE_I8:
      case t_base_type::TYPE_I16:
      case t_base_type::TYPE_I32:
      case t_base_type::TYPE_I64:
        result += " = 0";
        break;
      case t_base_type::TYPE_DOUBLE:
        result += " = 0.0";
        break;
      default:
        throw "compiler error: no C++ initializer for base type " + t_base_type::t_base_name(tbase);
      }
    } else if (type->is_enum()) {
      result += " = static_cast<" + type_name(type) + ">(0)";
    }
  }
  if (!reference) {
    result += ";";
  }
  return result;
}